

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

void writeReads(BamReader *br,RefVector *ref,int refID,string *refName,int st,int en,int bpRegion,
               string *folderPath)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  BamAlignment *in_stack_fffffffffffffb68;
  BamAlignment *in_stack_fffffffffffffb70;
  int *in_stack_fffffffffffffb80;
  undefined5 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8d;
  undefined1 in_stack_fffffffffffffb8e;
  undefined1 in_stack_fffffffffffffb8f;
  undefined4 in_stack_fffffffffffffb94;
  undefined1 local_468 [7];
  bool isSC;
  vector<int,_std::allocator<int>_> genomePositions;
  vector<int,_std::allocator<int>_> readPositions;
  vector<int,_std::allocator<int>_> clipSizes;
  BamAlignment aln;
  undefined1 local_2c0 [8];
  vector<SoftCluster,_std::allocator<SoftCluster>_> insClustersDown;
  vector<SoftCluster,_std::allocator<SoftCluster>_> insClustersUp;
  vector<SoftNode,_std::allocator<SoftNode>_> insNodesDown;
  vector<SoftNode,_std::allocator<SoftNode>_> insNodesUp;
  undefined1 local_250 [8];
  string outFile;
  ofstream ofs;
  int en_local;
  int st_local;
  string *refName_local;
  int refID_local;
  RefVector *ref_local;
  BamReader *br_local;
  
  std::ofstream::ofstream((void *)((long)&outFile.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                 folderPath,"tmp/ins/reads.fastq");
  _Var2 = std::operator|(_S_out,_S_app);
  std::ofstream::open((string *)(outFile.field_2._M_local_buf + 8),(_Ios_Openmode)local_250);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::vector
            ((vector<SoftNode,_std::allocator<SoftNode>_> *)
             &insNodesDown.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::vector
            ((vector<SoftNode,_std::allocator<SoftNode>_> *)
             &insClustersUp.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<SoftCluster,_std::allocator<SoftCluster>_>::vector
            ((vector<SoftCluster,_std::allocator<SoftCluster>_> *)
             &insClustersDown.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<SoftCluster,_std::allocator<SoftCluster>_>::vector
            ((vector<SoftCluster,_std::allocator<SoftCluster>_> *)local_2c0);
  BamTools::BamReader::SetRegion
            ((BamReader *)
             CONCAT17(genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._7_1_,
                      genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._0_7_),_local_468,
             (int *)CONCAT44(in_stack_fffffffffffffb94,_Var2),
             (int *)CONCAT17(in_stack_fffffffffffffb8f,
                             CONCAT16(in_stack_fffffffffffffb8e,
                                      CONCAT15(in_stack_fffffffffffffb8d,in_stack_fffffffffffffb88))
                            ),in_stack_fffffffffffffb80);
  BamTools::BamAlignment::BamAlignment
            ((BamAlignment *)
             genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  while (bVar1 = BamTools::BamReader::GetNextAlignment
                           ((BamReader *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68), bVar1
        ) {
    bVar1 = BamTools::BamAlignment::IsMapped
                      ((BamAlignment *)
                       &clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      if (0x13 < aln.RefID._2_2_) {
        in_stack_fffffffffffffb70 =
             (BamAlignment *)
             &readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb70);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_468);
        bVar1 = BamTools::BamAlignment::GetSoftClips
                          ((BamAlignment *)
                           readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                           (vector<int,_std::allocator<int>_> *)
                           readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (vector<int,_std::allocator<int>_> *)
                           genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                           (vector<int,_std::allocator<int>_> *)
                           genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                           (bool)genomePositions.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._7_1_);
        if (bVar1) {
          outputFastq((BamAlignment *)
                      &clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (ofstream *)(outFile.field_2._M_local_buf + 8));
          addSC((BamAlignment *)
                &clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,ref,
                (vector<SoftNode,_std::allocator<SoftNode>_> *)
                &insNodesDown.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                (vector<SoftNode,_std::allocator<SoftNode>_> *)
                &insClustersUp.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_468);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &genomePositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &readPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      outputFastq((BamAlignment *)
                  &clipSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                  (ofstream *)(outFile.field_2._M_local_buf + 8));
    }
  }
  std::ofstream::close();
  BamTools::BamAlignment::~BamAlignment(in_stack_fffffffffffffb70);
  std::vector<SoftCluster,_std::allocator<SoftCluster>_>::~vector
            ((vector<SoftCluster,_std::allocator<SoftCluster>_> *)local_2c0);
  std::vector<SoftCluster,_std::allocator<SoftCluster>_>::~vector
            ((vector<SoftCluster,_std::allocator<SoftCluster>_> *)
             &insClustersDown.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector
            ((vector<SoftNode,_std::allocator<SoftNode>_> *)
             &insClustersUp.super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector
            ((vector<SoftNode,_std::allocator<SoftNode>_> *)
             &insNodesDown.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_250);
  std::ofstream::~ofstream((void *)((long)&outFile.field_2 + 8));
  return;
}

Assistant:

void writeReads(BamTools::BamReader &br, const BamTools::RefVector &ref, int refID, const std::string &refName, int st, int en, int bpRegion, const std::string &folderPath)
{
	std::ofstream ofs;
	std::string outFile = folderPath + "tmp/ins/reads.fastq";
	ofs.open(outFile, std::ofstream::out | std::ofstream::app);

	std::vector<SoftNode> insNodesUp, insNodesDown;
	std::vector<SoftCluster> insClustersUp, insClustersDown;

	br.SetRegion(refID, st - bpRegion, refID, en + bpRegion);
	BamTools::BamAlignment aln;
	while (br.GetNextAlignment(aln))
	{
		// OEA unmapped reads have mapping qual 0
		// current aln is unmapped, but it's mate lies in region, hence we can even parse cur aln
		if (!aln.IsMapped())
		{
			outputFastq(aln, ofs);
			continue;
		}

		if (aln.MapQuality < MIN_MAP_QUAL)
			continue;

		std::vector<int> clipSizes, readPositions, genomePositions;
		bool isSC = aln.GetSoftClips(clipSizes, readPositions, genomePositions);
		if (isSC)
		{
			outputFastq(aln, ofs);
			addSC(aln, ref, insNodesUp, insNodesDown);
		}
	}
	ofs.close();
}